

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ConstraintBlockSymbol::ConstraintBlockSymbol
          (ConstraintBlockSymbol *this,Compilation *c,string_view name,SourceLocation loc)

{
  Compilation *c_local;
  ConstraintBlockSymbol *this_local;
  SourceLocation loc_local;
  string_view name_local;
  
  Symbol::Symbol(&this->super_Symbol,ConstraintBlock,name,loc);
  Scope::Scope(&this->super_Scope,c,&this->super_Symbol);
  this->thisVar = (VariableSymbol *)0x0;
  this->isStatic = false;
  this->isExtern = false;
  this->isExplicitExtern = false;
  this->isPure = false;
  this->constraint = (Constraint *)0x0;
  this->outOfBlockIndex = 0;
  return;
}

Assistant:

ConstraintBlockSymbol::ConstraintBlockSymbol(Compilation& c, string_view name, SourceLocation loc) :
    Symbol(SymbolKind::ConstraintBlock, name, loc), Scope(c, this) {
}